

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_window.c
# Opt level: O1

void fft_pitch_shift(fft_window_data *data,void *user)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  float *pfVar4;
  void *pvVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  void *pvVar11;
  uint32_t k;
  ulong uVar12;
  size_t __n;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined8 uStack_a0;
  ulong local_98;
  float *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  double local_70;
  double local_68;
  float local_60;
  float local_5c;
  void *local_58;
  double local_50;
  void *local_48;
  double local_40;
  double local_38;
  
  local_98 = data->framesize;
  local_88 = (ulong)(uint)data->oversampling;
  local_80 = local_98 >> 1 & 0x7fffffff;
  pfVar3 = data->fft_workspace;
  pfVar4 = data->last_phase;
  local_90 = data->phase_sum;
  local_78 = local_98 & 0xffffffff;
  uVar9 = local_78 * 4 + 0xf & 0xfffffffffffffff0;
  local_40 = (double)((long)&local_98 - uVar9);
  lVar10 = (long)local_40 - uVar9;
  local_48 = (void *)(lVar10 - uVar9);
  pvVar11 = (void *)((long)local_48 - uVar9);
  uVar12 = 0;
  local_70 = (double)data->samplerate / (double)local_78;
  local_68 = ((double)((local_98 & 0xffffffff) / local_88) * 6.283185307179586) / (double)local_78;
  local_5c = *user;
  local_50 = (double)CONCAT44(local_50._4_4_,(float)local_88);
  uVar9 = (ulong)((int)local_80 + 1);
  local_58 = pvVar11;
  do {
    fVar1 = pfVar3[uVar12 * 2];
    fVar2 = pfVar3[uVar12 * 2 + 1];
    auVar14._0_8_ = (double)(fVar1 * fVar1 + fVar2 * fVar2);
    auVar14._8_8_ = 0;
    if (auVar14._0_8_ < 0.0) {
      local_38 = (double)CONCAT44(local_38._4_4_,fVar1);
      local_60 = fVar2;
      *(undefined8 *)((long)pvVar11 + -8) = 0x12694a;
      dVar13 = sqrt(auVar14._0_8_);
      fVar1 = local_38._0_4_;
      fVar2 = local_60;
    }
    else {
      auVar14 = vsqrtsd_avx(auVar14,auVar14);
      dVar13 = auVar14._0_8_;
    }
    local_38 = (double)CONCAT44(local_38._4_4_,(float)(dVar13 + dVar13));
    *(undefined8 *)((long)pvVar11 + -8) = 0x12696e;
    dVar13 = atan2((double)fVar2,(double)fVar1);
    dVar15 = (double)(float)((double)((float)dVar13 - pfVar4[uVar12]) -
                            (double)(int)uVar12 * local_68);
    uVar7 = (ulong)(dVar15 / 3.141592653589793);
    uVar8 = uVar7 & 0xfffffffffffffffe;
    if (-1 < (long)uVar7) {
      uVar8 = ((uint)uVar7 & 1) + uVar7;
    }
    pfVar4[uVar12] = (float)dVar13;
    dVar13 = local_70 *
             (double)(((float)((double)(long)uVar8 * -3.141592653589793 + dVar15) * local_50._0_4_)
                     / 6.2831855);
    dVar15 = (double)(int)uVar12 * local_70;
    *(float *)(lVar10 + uVar12 * 4) = local_38._0_4_;
    pvVar5 = local_58;
    *(float *)((long)local_40 + uVar12 * 4) = (float)(dVar15 + dVar13);
    uVar12 = uVar12 + 1;
  } while (uVar9 != uVar12);
  __n = local_78 << 2;
  uVar12 = 0;
  *(undefined8 *)((long)pvVar11 + -8) = 0x126a40;
  memset(pvVar5,0,__n);
  pvVar5 = local_48;
  *(undefined8 *)((long)pvVar11 + -8) = 0x126a4e;
  memset(pvVar5,0,__n);
  pvVar5 = local_48;
  pfVar4 = local_90;
  do {
    uVar8 = (ulong)(local_5c * (float)(int)uVar12);
    if ((uint)uVar8 <= (uint)local_80) {
      uVar8 = uVar8 & 0xffffffff;
      *(float *)((long)local_58 + uVar8 * 4) =
           *(float *)(lVar10 + uVar12 * 4) + *(float *)((long)local_58 + uVar8 * 4);
      *(float *)((long)local_48 + uVar8 * 4) = local_5c * *(float *)((long)local_40 + uVar12 * 4);
    }
    uVar12 = uVar12 + 1;
  } while (uVar9 != uVar12);
  local_50 = (double)(local_88 & 0xffffffff);
  uVar12 = 0;
  do {
    fVar1 = (float)((double)(int)uVar12 * local_68 +
                   (double)(float)(((double)(float)((double)(float)((double)*(float *)((long)pvVar5
                                                                                      + uVar12 * 4)
                                                                   - (double)(int)uVar12 * local_70)
                                                   / local_70) * 6.283185307179586) / local_50)) +
            pfVar4[uVar12];
    local_38 = (double)*(float *)((long)local_58 + uVar12 * 4);
    pfVar4[uVar12] = fVar1;
    dVar13 = (double)fVar1;
    local_40 = dVar13;
    *(undefined8 *)((long)pvVar11 + -8) = 0x126b2a;
    dVar15 = cos(dVar13);
    dVar13 = local_40;
    pfVar3[uVar12 * 2] = (float)(dVar15 * local_38);
    *(undefined8 *)((long)pvVar11 + -8) = 0x126b44;
    dVar13 = sin(dVar13);
    pfVar3[uVar12 * 2 + 1] = (float)(dVar13 * local_38);
    uVar12 = uVar12 + 1;
  } while (uVar9 != uVar12);
  uVar6 = (int)local_98 + 2;
  if (uVar6 < (uint)((int)local_98 * 2)) {
    memset(pfVar3 + uVar6,0,(local_98 * 4 + 0x3fffffff4 & 0x3fffffffc) + 4);
    return;
  }
  return;
}

Assistant:

VECTORIZE void fft_pitch_shift(struct fft_window_data *data, void *user){
  uint32_t framesize = data->framesize;
  uint32_t oversampling = data->oversampling;
  uint32_t framesize2 = framesize/2;
  float *restrict fft_workspace = data->fft_workspace;
  float *restrict last_phase = data->last_phase;
  float *restrict phase_sum = data->phase_sum;
  float analyzed_frequency[framesize];
  float analyzed_magnitude[framesize];
  float synthesized_frequency[framesize];
  float synthesized_magnitude[framesize];

  uint32_t step = framesize/oversampling;
  double bin_frequencies = (double)data->samplerate/(double)framesize;
  double expected = 2.*M_PI*(double)step/(double)framesize;
  float pitch_shift = *((float*)user);

  for(uint32_t k = 0; k <= framesize2; k++){
    float real = fft_workspace[2*k];
    float imag = fft_workspace[2*k+1];

    float magnitude = 2.*sqrt(real*real + imag*imag);
    float phase = atan2(imag,real);
    float tmp = phase - last_phase[k];
    last_phase[k] = phase;
    tmp -= (double)k*expected;
    long qpd = tmp/M_PI;
    if (qpd >= 0) qpd += qpd&1;
    else qpd -= qpd&1;
    tmp -= M_PI*(double)qpd;
    tmp = oversampling*tmp/(2.*M_PI);
    tmp = (double)k*bin_frequencies + tmp*bin_frequencies;

    analyzed_magnitude[k] = magnitude;
    analyzed_frequency[k] = tmp;
  }

  memset(synthesized_magnitude, 0, framesize*sizeof(float));
  memset(synthesized_frequency, 0, framesize*sizeof(float));
  for(uint32_t k = 0; k <= framesize2; k++){
    uint32_t index = k*pitch_shift;
    if(index <= framesize2){
      synthesized_magnitude[index] += analyzed_magnitude[k];
      synthesized_frequency[index] = analyzed_frequency[k] * pitch_shift;
    }
  }

  for(uint32_t k = 0; k <= framesize2; k++){
    float magnitude = synthesized_magnitude[k];
    float tmp = synthesized_frequency[k];

    tmp -= (double)k*bin_frequencies;
    tmp /= bin_frequencies;
    tmp = 2.*M_PI*tmp/oversampling;
    tmp += (double)k*expected;
    phase_sum[k] += tmp;

    float phase = phase_sum[k];
    fft_workspace[2*k] = magnitude*cos(phase);
    fft_workspace[2*k+1] = magnitude*sin(phase);
  }

  for(uint32_t k = framesize+2; k < 2*framesize; k++)
    fft_workspace[k] = 0.;
}